

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3Fts5ConfigParse
              (Fts5Global *pGlobal,sqlite3 *db,int nArg,char **azArg,Fts5Config **ppOut,char **pzErr
              )

{
  char cVar1;
  bool bVar2;
  u8 *puVar3;
  byte bVar4;
  int iVar5;
  int iVar6;
  Fts5Config *pConfig;
  char **ppcVar7;
  char *pcVar8;
  char *pcVar9;
  size_t sVar10;
  int *piVar11;
  byte *pbVar12;
  byte *pbVar13;
  byte bVar14;
  long lVar15;
  ulong uVar16;
  long lVar17;
  uchar uVar18;
  uint uVar19;
  uchar uVar20;
  char **ppcVar21;
  long lVar22;
  byte *pbVar23;
  bool bVar24;
  int bDummy;
  char *zTwo;
  int bMustBeCol;
  char *zOne;
  int local_b0;
  int local_ac;
  char **local_a8;
  byte *local_a0;
  char **local_98;
  int local_8c;
  Fts5Buffer local_88;
  char **local_70;
  long local_68;
  Fts5Config **local_60;
  byte *local_58;
  Fts5Tokenizer **local_50;
  Fts5Global *local_48;
  fts5_tokenizer **local_40;
  long local_38;
  
  local_b0 = 0;
  local_a8 = pzErr;
  iVar5 = sqlite3_initialize();
  iVar6 = 7;
  if (iVar5 != 0) goto LAB_001a05ce;
  local_98 = azArg;
  pConfig = (Fts5Config *)sqlite3Malloc(0xa8);
  *ppOut = pConfig;
  if (pConfig == (Fts5Config *)0x0) {
    return 7;
  }
  memset(&pConfig->zDb,0,0xa0);
  pConfig->db = db;
  pConfig->iCookie = -1;
  lVar22 = (long)nArg;
  ppcVar7 = (char **)sqlite3Fts5MallocZero(&local_b0,lVar22 * 9);
  ppcVar21 = local_98;
  pConfig->azCol = ppcVar7;
  pConfig->abUnindexed = (u8 *)(ppcVar7 + lVar22);
  local_38 = lVar22;
  pcVar8 = sqlite3Fts5Strndup(&local_b0,local_98[1],-1);
  pConfig->zDb = pcVar8;
  pcVar8 = sqlite3Fts5Strndup(&local_b0,ppcVar21[2],-1);
  iVar6 = local_b0;
  pConfig->zName = pcVar8;
  pConfig->bColumnsize = 1;
  pConfig->eDetail = 0;
  if ((pcVar8 == (char *)0x0 || local_b0 != 0) ||
     (iVar5 = sqlite3StrICmp(pcVar8,"rank"), iVar5 != 0)) {
    bVar24 = iVar6 == 0;
    local_60 = ppOut;
    local_48 = pGlobal;
    if (3 < nArg && bVar24) {
      local_50 = &pConfig->pTok;
      local_40 = &pConfig->pTokApi;
      lVar22 = 3;
      ppcVar21 = local_98;
LAB_0019fc48:
      local_88.p = (u8 *)0x0;
      local_a0 = (byte *)0x0;
      local_8c = 0;
      pcVar8 = fts5ConfigGobbleWord(&local_b0,ppcVar21[lVar22],(char **)&local_88,&local_8c);
      bVar24 = true;
      if (pcVar8 == (char *)0x0) {
        bVar2 = true;
LAB_0019fd89:
        iVar6 = local_b0;
        if (local_b0 != 0) goto LAB_001a0473;
        if (bVar24) {
          pcVar8 = sqlite3_mprintf("parse error in \"%s\"");
          *local_a8 = pcVar8;
          local_b0 = 1;
          iVar6 = local_b0;
          goto LAB_001a0473;
        }
        pbVar23 = local_a0;
        if (bVar2) goto LAB_0019fdd2;
LAB_0019fcde:
        puVar3 = local_88.p;
        if (pbVar23 == (byte *)0x0) {
          pbVar23 = (byte *)0x1e2cdf;
        }
        local_ac = 0;
        sVar10 = strlen((char *)local_88.p);
        if (puVar3 != (u8 *)0x0) {
          if (0 < (int)sVar10) {
            pbVar12 = puVar3 + 6;
            lVar15 = (ulong)((int)sVar10 - 1) + 1;
            lVar17 = 0;
            do {
              if (lVar17 == 6) {
                uVar18 = '\0';
                pbVar13 = pbVar12;
LAB_0019fe88:
                if (uVar18 != ""[*pbVar13]) {
                  pbVar13 = puVar3 + 8;
                  lVar17 = 0;
                  goto LAB_0019ff62;
                }
                break;
              }
              uVar18 = ""[(byte)"prefix"[lVar17]];
              if (uVar18 != ""[puVar3[lVar17]]) {
                pbVar13 = puVar3 + lVar17;
                goto LAB_0019fe88;
              }
              lVar17 = lVar17 + 1;
            } while (lVar15 != lVar17);
          }
          piVar11 = pConfig->aPrefix;
          if (piVar11 != (int *)0x0) {
LAB_0019fea5:
            bVar4 = 0;
            do {
              pbVar23 = pbVar23 + -1;
              do {
                bVar14 = pbVar23[1];
                pbVar23 = pbVar23 + 1;
              } while (bVar14 == 0x20);
              if ((bool)(~bVar4 & 1 | bVar14 != 0x2c)) {
                if (bVar14 == 0) goto LAB_001a02cb;
              }
              else {
                do {
                  bVar14 = pbVar23[1];
                  pbVar23 = pbVar23 + 1;
                } while (bVar14 == 0x20);
              }
              if ((byte)(bVar14 - 0x3a) < 0xf6) {
                pcVar8 = "malformed prefix=... directive";
                goto LAB_0019ffaf;
              }
              if ((long)pConfig->nPrefix == 0x1f) {
                pcVar8 = sqlite3_mprintf("too many prefix indexes (max %d)");
                goto LAB_001a0462;
              }
              iVar6 = 0;
              do {
                if ((0x39 < bVar14) || (999 < iVar6)) break;
                iVar6 = (uint)(byte)(bVar14 - 0x30) + iVar6 * 10;
                bVar14 = pbVar23[1];
                pbVar23 = pbVar23 + 1;
              } while ('/' < (char)bVar14);
              if (iVar6 - 1000U < 0xfffffc19) goto LAB_0019ffa8;
              piVar11[pConfig->nPrefix] = iVar6;
              pConfig->nPrefix = pConfig->nPrefix + 1;
              bVar4 = 1;
            } while( true );
          }
          piVar11 = (int *)sqlite3Fts5MallocZero(&local_ac,0x7c);
          pConfig->aPrefix = piVar11;
          iVar6 = local_ac;
          if (local_ac == 0) goto LAB_0019fea5;
          goto LAB_001a0473;
        }
LAB_001a044f:
        pcVar8 = sqlite3_mprintf("unrecognized option: \"%.*s\"",sVar10 & 0xffffffff,puVar3);
        goto LAB_001a0462;
      }
      do {
        pcVar9 = pcVar8;
        cVar1 = *pcVar9;
        pcVar8 = pcVar9 + 1;
      } while (cVar1 == ' ');
      bVar2 = cVar1 != '=';
      if ((cVar1 == '=') && (pcVar9 = pcVar9 + 1, local_8c != 0)) {
        bVar2 = false;
        goto LAB_0019fd89;
      }
      pcVar9 = pcVar9 + -1;
      do {
        pcVar8 = pcVar9 + 1;
        pcVar9 = pcVar9 + 1;
      } while (*pcVar8 == ' ');
      if (*pcVar8 != '\0') {
        pcVar8 = fts5ConfigGobbleWord(&local_b0,pcVar9,(char **)&local_a0,&local_ac);
        if (pcVar8 == (char *)0x0) {
          bVar24 = true;
        }
        else {
          bVar24 = *pcVar8 != '\0';
        }
        goto LAB_0019fd89;
      }
      iVar6 = local_b0;
      if (local_b0 != 0) goto LAB_001a0473;
      pbVar23 = (byte *)0x0;
      if (cVar1 == '=') goto LAB_0019fcde;
LAB_0019fdd2:
      puVar3 = local_88.p;
      if ((local_88.p == (u8 *)0x0) ||
         ((iVar6 = sqlite3StrICmp((char *)local_88.p,"rank"), iVar6 != 0 &&
          (iVar6 = sqlite3StrICmp((char *)puVar3,"rowid"), iVar6 != 0)))) {
        iVar6 = 0;
        if (pbVar23 != (byte *)0x0) {
          iVar5 = sqlite3StrICmp((char *)pbVar23,"unindexed");
          if (iVar5 != 0) {
            pcVar8 = "unrecognized column option: %s";
            goto LAB_0019fe32;
          }
          pConfig->abUnindexed[pConfig->nCol] = '\x01';
        }
      }
      else {
        pcVar8 = "reserved fts5 column name: %s";
LAB_0019fe32:
        pcVar8 = sqlite3_mprintf(pcVar8);
        *local_a8 = pcVar8;
        iVar6 = 1;
      }
      iVar5 = pConfig->nCol;
      pConfig->nCol = iVar5 + 1;
      pConfig->azCol[iVar5] = (char *)puVar3;
      local_88.p = (u8 *)0x0;
      ppcVar21 = local_98;
      goto LAB_001a0473;
    }
LAB_001a049f:
    ppOut = local_60;
    if (bVar24) {
      if (pConfig->pTok == (Fts5Tokenizer *)0x0) {
        iVar6 = sqlite3Fts5GetTokenizer
                          (local_48,(char **)0x0,0,&pConfig->pTok,&pConfig->pTokApi,(char **)0x0);
        local_b0 = iVar6;
      }
      if (iVar6 == 0) {
        if (pConfig->zContent == (char *)0x0) {
          if (pConfig->eContent == 0) {
            pcVar8 = "content";
          }
          else {
            if (pConfig->bColumnsize == 0) goto LAB_001a04e8;
            pcVar8 = "docsize";
          }
          pcVar8 = sqlite3Fts5Mprintf(&local_b0,"%Q.\'%q_%s\'",pConfig->zDb,pConfig->zName,pcVar8);
          pConfig->zContent = pcVar8;
          iVar6 = local_b0;
          if (local_b0 != 0) goto LAB_001a05c3;
        }
LAB_001a04e8:
        pcVar8 = pConfig->zContentRowid;
        if (pcVar8 == (char *)0x0) {
          pcVar8 = sqlite3Fts5Strndup(&local_b0,"rowid",-1);
          pConfig->zContentRowid = pcVar8;
          iVar6 = local_b0;
          if (local_b0 != 0) goto LAB_001a05c3;
        }
        local_a0 = (byte *)((ulong)local_a0 & 0xffffffff00000000);
        local_88.p = (u8 *)0x0;
        local_88.n = 0;
        local_88.nSpace = 0;
        sqlite3Fts5BufferAppendPrintf((int *)&local_a0,&local_88,"T.%Q",pcVar8);
        if ((pConfig->eContent != 1) && (0 < pConfig->nCol)) {
          uVar16 = 0;
          do {
            if (pConfig->eContent == 2) {
              sqlite3Fts5BufferAppendPrintf
                        ((int *)&local_a0,&local_88,", T.%Q",pConfig->azCol[uVar16]);
            }
            else {
              sqlite3Fts5BufferAppendPrintf
                        ((int *)&local_a0,&local_88,", T.c%d",uVar16 & 0xffffffff);
            }
            uVar16 = uVar16 + 1;
          } while ((long)uVar16 < (long)pConfig->nCol);
        }
        pConfig->zContentExprlist = (char *)local_88.p;
        ppOut = local_60;
        iVar6 = (int)local_a0;
        if ((int)local_a0 == 0) {
          return 0;
        }
      }
    }
  }
  else {
    pcVar8 = sqlite3_mprintf("reserved fts5 table name: %s",pcVar8);
    *local_a8 = pcVar8;
    iVar6 = 1;
  }
LAB_001a05c3:
  sqlite3Fts5ConfigFree(pConfig);
LAB_001a05ce:
  *ppOut = (Fts5Config *)0x0;
  return iVar6;
  while( true ) {
    uVar18 = ""[(byte)"fts3tokenize"[lVar17 + 4]];
    if (uVar18 != ""[puVar3[lVar17]]) {
      pbVar13 = puVar3 + lVar17;
      goto LAB_0019ffc6;
    }
    lVar17 = lVar17 + 1;
    if (lVar15 == lVar17) break;
LAB_0019ff62:
    if (lVar17 == 8) {
      uVar18 = '\0';
LAB_0019ffc6:
      if (uVar18 != ""[*pbVar13]) {
        pbVar13 = puVar3 + 7;
        lVar17 = 0;
        goto LAB_001a0050;
      }
      break;
    }
  }
  sVar10 = strlen((char *)pbVar23);
  ppcVar7 = (char **)sqlite3Fts5MallocZero(&local_ac,sVar10 * 8 + 8);
  pbVar12 = (byte *)sqlite3Fts5MallocZero(&local_ac,sVar10 * 2 + 2);
  iVar6 = local_ac;
  local_70 = ppcVar7;
  local_58 = pbVar12;
  if (ppcVar7 != (char **)0x0 && pbVar12 != (byte *)0x0) {
    if (*local_50 == (Fts5Tokenizer *)0x0) {
      bVar4 = *pbVar23;
      local_68 = 0;
      do {
        if (bVar4 == 0x20) {
          do {
            bVar4 = pbVar23[1];
            pbVar23 = pbVar23 + 1;
          } while (bVar4 == 0x20);
        }
        else if (bVar4 == 0) {
          iVar6 = sqlite3Fts5GetTokenizer
                            (local_48,local_70,(int)local_68,local_50,local_40,local_a8);
          ppcVar21 = local_98;
          goto LAB_001a024d;
        }
        if (bVar4 == 0x27) {
          pbVar13 = (byte *)fts5ConfigSkipLiteral((char *)pbVar23);
          if (pbVar13 == (byte *)0x0) goto LAB_001a0206;
        }
        else {
          lVar15 = 0;
          while (((char)bVar4 < '\0' || ((&DAT_001dc1e0)[bVar4] != '\0'))) {
            lVar17 = lVar15 + 1;
            lVar15 = lVar15 + 1;
            bVar4 = pbVar23[lVar17];
          }
          if (lVar15 == 0) goto LAB_001a0206;
          pbVar13 = pbVar23 + lVar15;
        }
        sVar10 = (long)pbVar13 - (long)pbVar23;
        memcpy(pbVar12,pbVar23,sVar10);
        local_70[local_68] = (char *)pbVar12;
        if ((*pbVar12 - 0x22 < 0x3f) &&
           ((0x4200000000000021U >> ((ulong)(*pbVar12 - 0x22) & 0x3f) & 1) != 0)) {
          fts5Dequote((char *)pbVar12);
        }
        pbVar23 = pbVar13 + -1;
        do {
          bVar4 = pbVar23[1];
          pbVar23 = pbVar23 + 1;
        } while (bVar4 == 0x20);
        pbVar12 = pbVar12 + sVar10 + 1;
        local_68 = local_68 + 1;
      } while( true );
    }
    pcVar8 = sqlite3_mprintf("multiple tokenize=... directives");
    *local_a8 = pcVar8;
    iVar6 = 1;
  }
LAB_001a024d:
  sqlite3_free(local_70);
  sqlite3_free(local_58);
  goto LAB_001a0473;
  while( true ) {
    uVar18 = ""[(byte)"_content"[lVar17 + 1]];
    if (uVar18 != ""[puVar3[lVar17]]) {
      pbVar13 = puVar3 + lVar17;
      goto LAB_001a0174;
    }
    lVar17 = lVar17 + 1;
    if (lVar15 == lVar17) break;
LAB_001a0050:
    if (lVar17 == 7) {
      uVar18 = '\0';
LAB_001a0174:
      if (uVar18 != ""[*pbVar13]) {
        pbVar13 = puVar3 + 0xd;
        lVar17 = 0;
        goto LAB_001a019a;
      }
      break;
    }
  }
  if (pConfig->eContent == 0) {
    if (*pbVar23 != 0) {
      pConfig->eContent = 2;
      pcVar8 = sqlite3Fts5Mprintf(&local_ac,"%Q.%Q",pConfig->zDb,pbVar23);
      pConfig->zContent = pcVar8;
      iVar6 = local_ac;
      goto LAB_001a0473;
    }
    pConfig->eContent = 1;
    goto LAB_001a02cb;
  }
  pcVar8 = "multiple content=... directives";
  goto LAB_0019ffaf;
  while( true ) {
    uVar18 = ""[(byte)"content_rowid"[lVar17]];
    if (uVar18 != ""[puVar3[lVar17]]) {
      pbVar13 = puVar3 + lVar17;
      goto LAB_001a0271;
    }
    lVar17 = lVar17 + 1;
    if (lVar15 == lVar17) break;
LAB_001a019a:
    if (lVar17 == 0xd) {
      uVar18 = '\0';
LAB_001a0271:
      if (uVar18 != ""[*pbVar13]) {
        pbVar13 = puVar3 + 10;
        lVar17 = 0;
        goto LAB_001a0297;
      }
      break;
    }
  }
  if (pConfig->zContentRowid == (char *)0x0) {
    pcVar8 = sqlite3Fts5Strndup(&local_ac,(char *)pbVar23,-1);
    pConfig->zContentRowid = pcVar8;
    iVar6 = local_ac;
    goto LAB_001a0473;
  }
  pcVar8 = "multiple content_rowid=... directives";
  goto LAB_0019ffaf;
  while( true ) {
    uVar18 = ""[(byte)"columnsize"[lVar17]];
    if (uVar18 != ""[puVar3[lVar17]]) {
      pbVar13 = puVar3 + lVar17;
      goto LAB_001a02fc;
    }
    lVar17 = lVar17 + 1;
    if (lVar15 == lVar17) break;
LAB_001a0297:
    if (lVar17 == 10) {
      uVar18 = '\0';
LAB_001a02fc:
      if (uVar18 != ""[*pbVar13]) {
        lVar17 = 0;
        goto LAB_001a032b;
      }
      break;
    }
  }
  if (((*pbVar23 & 0xfe) == 0x30) && (pbVar23[1] == 0)) {
    pConfig->bColumnsize = (uint)(*pbVar23 == 0x31);
    goto LAB_001a02cb;
  }
  pcVar8 = "malformed columnsize=... directive";
  goto LAB_0019ffaf;
  while( true ) {
    uVar18 = ""[(byte)"detail"[lVar17]];
    if (uVar18 != ""[puVar3[lVar17]]) {
      pbVar12 = puVar3 + lVar17;
      goto LAB_001a037e;
    }
    lVar17 = lVar17 + 1;
    if (lVar15 == lVar17) break;
LAB_001a032b:
    if (lVar17 == 6) {
      uVar18 = '\0';
LAB_001a037e:
      if (uVar18 != ""[*pbVar12]) goto LAB_001a044f;
      break;
    }
  }
  sVar10 = strlen((char *)pbVar23);
  iVar6 = -1;
  lVar15 = 0;
  pcVar8 = "none";
  do {
    if (0 < (int)sVar10) {
      lVar17 = 0;
      uVar19 = (int)sVar10 + 1;
      do {
        if ((ulong)(byte)pcVar8[lVar17] == 0) {
          uVar20 = ""[pbVar23[lVar17]];
          uVar18 = '\0';
LAB_001a03f6:
          if (uVar18 != uVar20) goto LAB_001a041f;
          break;
        }
        uVar18 = ""[(byte)pcVar8[lVar17]];
        uVar20 = ""[pbVar23[lVar17]];
        if (uVar18 != uVar20) goto LAB_001a03f6;
        uVar19 = uVar19 - 1;
        lVar17 = lVar17 + 1;
      } while (1 < uVar19);
    }
    if (-1 < iVar6) goto LAB_001a0443;
    iVar6 = (&DAT_0020d2f8)[lVar15 * 4];
LAB_001a041f:
    lVar15 = lVar15 + 1;
    pcVar8 = *(char **)(&DAT_0020d2f0 + lVar15 * 0x10);
  } while (lVar15 != 3);
  pConfig->eDetail = iVar6;
  if (-1 < iVar6) {
LAB_001a02cb:
    iVar6 = 0;
    goto LAB_001a0473;
  }
LAB_001a0443:
  pcVar8 = "malformed detail=... directive";
LAB_0019ffaf:
  pcVar8 = sqlite3_mprintf(pcVar8);
LAB_001a0462:
  *local_a8 = pcVar8;
  iVar6 = 1;
LAB_001a0473:
  local_b0 = iVar6;
  iVar6 = local_b0;
  sqlite3_free(local_88.p);
  sqlite3_free(local_a0);
  bVar24 = iVar6 == 0;
  if ((!bVar24) || (lVar22 = lVar22 + 1, local_38 <= lVar22)) goto LAB_001a049f;
  goto LAB_0019fc48;
LAB_001a0206:
  pcVar8 = sqlite3_mprintf("parse error in tokenize directive");
  *local_a8 = pcVar8;
  iVar6 = 1;
  ppcVar21 = local_98;
  goto LAB_001a024d;
LAB_0019ffa8:
  pcVar8 = "prefix length out of range (max 999)";
  goto LAB_0019ffaf;
}

Assistant:

static int sqlite3Fts5ConfigParse(
  Fts5Global *pGlobal,
  sqlite3 *db,
  int nArg,                       /* Number of arguments */
  const char **azArg,             /* Array of nArg CREATE VIRTUAL TABLE args */
  Fts5Config **ppOut,             /* OUT: Results of parse */
  char **pzErr                    /* OUT: Error message */
){
  int rc = SQLITE_OK;             /* Return code */
  Fts5Config *pRet;               /* New object to return */
  int i;
  sqlite3_int64 nByte;

  *ppOut = pRet = (Fts5Config*)sqlite3_malloc(sizeof(Fts5Config));
  if( pRet==0 ) return SQLITE_NOMEM;
  memset(pRet, 0, sizeof(Fts5Config));
  pRet->db = db;
  pRet->iCookie = -1;

  nByte = nArg * (sizeof(char*) + sizeof(u8));
  pRet->azCol = (char**)sqlite3Fts5MallocZero(&rc, nByte);
  pRet->abUnindexed = (u8*)&pRet->azCol[nArg];
  pRet->zDb = sqlite3Fts5Strndup(&rc, azArg[1], -1);
  pRet->zName = sqlite3Fts5Strndup(&rc, azArg[2], -1);
  pRet->bColumnsize = 1;
  pRet->eDetail = FTS5_DETAIL_FULL;
#ifdef SQLITE_DEBUG
  pRet->bPrefixIndex = 1;
#endif
  if( rc==SQLITE_OK && sqlite3_stricmp(pRet->zName, FTS5_RANK_NAME)==0 ){
    *pzErr = sqlite3_mprintf("reserved fts5 table name: %s", pRet->zName);
    rc = SQLITE_ERROR;
  }

  for(i=3; rc==SQLITE_OK && i<nArg; i++){
    const char *zOrig = azArg[i];
    const char *z;
    char *zOne = 0;
    char *zTwo = 0;
    int bOption = 0;
    int bMustBeCol = 0;

    z = fts5ConfigGobbleWord(&rc, zOrig, &zOne, &bMustBeCol);
    z = fts5ConfigSkipWhitespace(z);
    if( z && *z=='=' ){
      bOption = 1;
      z++;
      if( bMustBeCol ) z = 0;
    }
    z = fts5ConfigSkipWhitespace(z);
    if( z && z[0] ){
      int bDummy;
      z = fts5ConfigGobbleWord(&rc, z, &zTwo, &bDummy);
      if( z && z[0] ) z = 0;
    }

    if( rc==SQLITE_OK ){
      if( z==0 ){
        *pzErr = sqlite3_mprintf("parse error in \"%s\"", zOrig);
        rc = SQLITE_ERROR;
      }else{
        if( bOption ){
          rc = fts5ConfigParseSpecial(pGlobal, pRet, zOne, zTwo?zTwo:"", pzErr);
        }else{
          rc = fts5ConfigParseColumn(pRet, zOne, zTwo, pzErr);
          zOne = 0;
        }
      }
    }

    sqlite3_free(zOne);
    sqlite3_free(zTwo);
  }

  /* If a tokenizer= option was successfully parsed, the tokenizer has
  ** already been allocated. Otherwise, allocate an instance of the default
  ** tokenizer (unicode61) now.  */
  if( rc==SQLITE_OK && pRet->pTok==0 ){
    rc = fts5ConfigDefaultTokenizer(pGlobal, pRet);
  }

  /* If no zContent option was specified, fill in the default values. */
  if( rc==SQLITE_OK && pRet->zContent==0 ){
    const char *zTail = 0;
    assert( pRet->eContent==FTS5_CONTENT_NORMAL 
         || pRet->eContent==FTS5_CONTENT_NONE 
    );
    if( pRet->eContent==FTS5_CONTENT_NORMAL ){
      zTail = "content";
    }else if( pRet->bColumnsize ){
      zTail = "docsize";
    }

    if( zTail ){
      pRet->zContent = sqlite3Fts5Mprintf(
          &rc, "%Q.'%q_%s'", pRet->zDb, pRet->zName, zTail
      );
    }
  }

  if( rc==SQLITE_OK && pRet->zContentRowid==0 ){
    pRet->zContentRowid = sqlite3Fts5Strndup(&rc, "rowid", -1);
  }

  /* Formulate the zContentExprlist text */
  if( rc==SQLITE_OK ){
    rc = fts5ConfigMakeExprlist(pRet);
  }

  if( rc!=SQLITE_OK ){
    sqlite3Fts5ConfigFree(pRet);
    *ppOut = 0;
  }
  return rc;
}